

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractfileengine.cpp
# Opt level: O2

void __thiscall
QAbstractFileEngineHandler::~QAbstractFileEngineHandler(QAbstractFileEngineHandler *this)

{
  QList<QAbstractFileEngineHandler_*> *c;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fileEngineHandlers>_> *this_00;
  long in_FS_OFFSET;
  QWriteLocker locker;
  QAbstractFileEngineHandler *local_28;
  QWriteLocker local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this->_vptr_QAbstractFileEngineHandler = (_func_int **)&PTR__QAbstractFileEngineHandler_00660ac0;
  local_20.q_val = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
  local_20.q_val =
       (quintptr)
       QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fileEngineHandlerMutex>_>::
       operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fileEngineHandlerMutex>_>
                   *)this);
  this_00 = (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fileEngineHandlers>_>
             *)&local_20;
  QWriteLocker::relock((QWriteLocker *)this_00);
  if (qt_abstractfileenginehandlerlist_shutDown == '\0') {
    c = &QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fileEngineHandlers>_>::
         operator()(this_00)->super_QList<QAbstractFileEngineHandler_*>;
    local_28 = this;
    QtPrivate::sequential_erase_one<QList<QAbstractFileEngineHandler*>,QAbstractFileEngineHandler*>
              (c,&local_28);
    if ((c->d).size == 0) {
      qt_file_engine_handlers_in_use._q_value.super___atomic_base<int>._M_i =
           (Type)(__atomic_base<int>)0x0;
    }
  }
  QWriteLocker::~QWriteLocker(&local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QAbstractFileEngineHandler::~QAbstractFileEngineHandler()
{
    QWriteLocker locker(fileEngineHandlerMutex());
    // Remove this handler from the handler list only if the list is valid.
    if (!qt_abstractfileenginehandlerlist_shutDown) {
        QAbstractFileEngineHandlerList *handlers = fileEngineHandlers();
        handlers->removeOne(this);
        if (handlers->isEmpty())
            qt_file_engine_handlers_in_use.storeRelaxed(false);
    }
}